

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

bool __thiscall draco::ObjEncoder::EncodePolygonalFaces(ObjEncoder *this)

{
  _Rb_tree_color _Var1;
  EncoderBuffer *pEVar2;
  mapped_type *pmVar3;
  FaceIndex face_id;
  PointIndex vert_index;
  AttributeValueIndex position_index;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> corner_table;
  PolygonEdges polygon_edges;
  undefined1 local_95;
  key_type local_94;
  _Head_base<0UL,_draco::CornerTable_*,_false> local_90;
  vector<bool,_std::allocator<bool>_> local_88;
  _Rb_tree<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::_Select1st<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  local_60;
  
  local_60._M_impl._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_88,
             (ulong)(uint)((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this->in_mesh_->faces_).vector_.
                                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555),(bool *)&local_60,(allocator_type *)&local_90);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateCornerTableFromPositionAttribute((draco *)&local_90,this->in_mesh_);
  if ((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->in_mesh_->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
    face_id.value_ = 0;
    do {
      EncodeFaceAttributes(this,face_id);
      std::
      _Rb_tree<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::_Select1st<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
      ::clear(&local_60);
      FindOriginalFaceEdges(this,face_id,local_90._M_head_impl,&local_88,(PolygonEdges *)&local_60);
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        _Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
        pEVar2 = this->out_buffer_;
        local_95 = 0x66;
        local_94.value_ = _Var1;
        if (pEVar2->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar2,
                     (pEVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_95,&local_94);
        }
        do {
          pmVar3 = std::
                   map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                   ::operator[]((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                                 *)&local_60,&local_94);
          vert_index.value_ = pmVar3->value_;
          EncodeFaceCorner(this,vert_index);
          if (this->pos_att_->identity_mapping_ == false) {
            vert_index.value_ =
                 (this->pos_att_->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
          }
          local_94.value_ = vert_index.value_;
        } while (vert_index.value_ != _Var1);
        pEVar2 = this->out_buffer_;
        if (pEVar2->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar2,
                     (pEVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,"\n","");
        }
      }
      face_id.value_ = face_id.value_ + 1;
    } while (face_id.value_ <
             (uint)((int)((ulong)((long)(this->in_mesh_->faces_).vector_.
                                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->in_mesh_->faces_).vector_.
                                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                   -0x55555555));
  }
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)&local_90);
  std::
  _Rb_tree<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::_Select1st<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodePolygonalFaces() {
  // TODO(vytyaz): This could be a much smaller set of visited face indices.
  std::vector<bool> triangle_visited(in_mesh_->num_faces(), false);
  PolygonEdges polygon_edges;
  std::unique_ptr<CornerTable> corner_table =
      CreateCornerTableFromPositionAttribute(in_mesh_);
  for (FaceIndex fi(0); fi < in_mesh_->num_faces(); ++fi) {
    EncodeFaceAttributes(fi);
    // Reconstruct polygon from the added edges attribute if available.
    polygon_edges.clear();
    FindOriginalFaceEdges(fi, *corner_table, &triangle_visited, &polygon_edges);

    // Polygon edges could be empty if this triangle has been visited as part
    // of a polygon discovery that started from an earler face.
    if (polygon_edges.empty()) {
      continue;
    }

    // Traverse a polygon by following its edges. The starting point is not
    // guaranteed to be the same as in the original polygon. It is
    // deterministic, however, and defined by std::map behavior.
    const AttributeValueIndex first_position_index =
        polygon_edges.begin()->first;
    AttributeValueIndex position_index = first_position_index;
    buffer()->Encode('f');
    do {
      // Get the next polygon point index by following polygon edge.
      const PointIndex pi = polygon_edges[position_index];
      EncodeFaceCorner(pi);
      position_index = pos_att_->mapped_index(pi).value();
    } while (position_index != first_position_index);
    buffer()->Encode("\n", 1);
  }
  return true;
}